

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O2

void __thiscall QButtonGroup::setId(QButtonGroup *this,QAbstractButton *button,int id)

{
  int *piVar1;
  long in_FS_OFFSET;
  QAbstractButton *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = button;
  if (id != -1 && button != (QAbstractButton *)0x0) {
    piVar1 = QHash<QAbstractButton_*,_int>::operator[]
                       ((QHash<QAbstractButton_*,_int> *)(*(long *)&this->field_0x8 + 0xa8),
                        &local_18);
    *piVar1 = id;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QButtonGroup::setId(QAbstractButton *button, int id)
{
    Q_D(QButtonGroup);
    if (button && id != -1)
        d->mapping[button] = id;
}